

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O2

uint8_t * LPCMStreamReader::findSubstr(char *pattern,uint8_t *buff,uint8_t *end)

{
  size_t sVar1;
  size_t j;
  size_t sVar2;
  uint8_t *curPos;
  
  sVar1 = strlen(pattern);
  do {
    if (end + -sVar1 <= buff) {
      return (uint8_t *)0x0;
    }
    sVar2 = 0;
    while ((sVar1 != sVar2 && (buff[sVar2] == pattern[sVar2]))) {
      sVar2 = sVar2 + 1;
      if (sVar1 == sVar2) {
        return buff;
      }
    }
    buff = buff + 1;
  } while( true );
}

Assistant:

uint8_t* LPCMStreamReader::findSubstr(const char* pattern, uint8_t* buff, const uint8_t* end)
{
    const size_t patternLen = strlen(pattern);
    for (uint8_t* curPos = buff; curPos < end - patternLen; curPos++)
    {
        for (size_t j = 0; j < patternLen; j++)
        {
            if (curPos[j] != static_cast<uint8_t>(pattern[j]))
                break;
            if (j == patternLen - 1)
                return curPos;
        }
    }
    return nullptr;
}